

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode header_append(Curl_easy *data,SingleRequest *k,size_t length)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  size_t local_48;
  size_t hbufp_index;
  char *newbuff;
  size_t newsize;
  size_t length_local;
  SingleRequest *k_local;
  Curl_easy *data_local;
  
  uVar3 = k->hbuflen + length;
  if (uVar3 < 0x19001) {
    if ((data->state).headersize <= uVar3) {
      if ((data->state).headersize * 2 < (k->hbuflen + length) * 3 >> 1) {
        local_48 = (k->hbuflen + length) * 3 >> 1;
      }
      else {
        local_48 = (data->state).headersize << 1;
      }
      pcVar1 = k->hbufp;
      pcVar2 = (data->state).headerbuff;
      pcVar4 = (char *)(*Curl_crealloc)((data->state).headerbuff,local_48);
      if (pcVar4 == (char *)0x0) {
        Curl_failf(data,"Failed to alloc memory for big header!");
        return CURLE_OUT_OF_MEMORY;
      }
      (data->state).headersize = local_48;
      (data->state).headerbuff = pcVar4;
      k->hbufp = (data->state).headerbuff + ((long)pcVar1 - (long)pcVar2);
    }
    memcpy(k->hbufp,k->str_start,length);
    k->hbufp = k->hbufp + length;
    k->hbuflen = length + k->hbuflen;
    *k->hbufp = '\0';
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf(data,"Rejected %zu bytes header (max is %d)!",uVar3,0x19000);
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode header_append(struct Curl_easy *data,
                              struct SingleRequest *k,
                              size_t length)
{
  /* length is at most the size of a full read buffer, for which the upper
     bound is CURL_MAX_READ_SIZE. There is thus no chance of overflow in this
     calculation. */
  size_t newsize = k->hbuflen + length;
  if(newsize > CURL_MAX_HTTP_HEADER) {
    /* The reason to have a max limit for this is to avoid the risk of a bad
       server feeding libcurl with a never-ending header that will cause
       reallocs infinitely */
    failf(data, "Rejected %zu bytes header (max is %d)!", newsize,
          CURL_MAX_HTTP_HEADER);
    return CURLE_OUT_OF_MEMORY;
  }
  if(newsize >= data->state.headersize) {
    /* We enlarge the header buffer as it is too small */
    char *newbuff;
    size_t hbufp_index;

    newsize = CURLMAX((k->hbuflen + length) * 3 / 2, data->state.headersize*2);
    hbufp_index = k->hbufp - data->state.headerbuff;
    newbuff = realloc(data->state.headerbuff, newsize);
    if(!newbuff) {
      failf(data, "Failed to alloc memory for big header!");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.headersize = newsize;
    data->state.headerbuff = newbuff;
    k->hbufp = data->state.headerbuff + hbufp_index;
  }
  memcpy(k->hbufp, k->str_start, length);
  k->hbufp += length;
  k->hbuflen += length;
  *k->hbufp = 0;

  return CURLE_OK;
}